

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memchr.c
# Opt level: O3

void * memchr(void *__s,int __c,size_t __n)

{
  uchar *p;
  
  if (__n != 0) {
    do {
      if (*__s == (char)__c) {
        return (char *)__s;
      }
      __s = (void *)((long)__s + 1);
      __n = __n - 1;
    } while (__n != 0);
  }
  return (void *)0x0;
}

Assistant:

void * memchr( const void * s, int c, size_t n )
{
    const unsigned char * p = ( const unsigned char * ) s;

    while ( n-- )
    {
        if ( *p == ( unsigned char ) c )
        {
            return ( void * ) p;
        }

        ++p;
    }

    return NULL;
}